

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O0

void __thiscall edk2_vss2_t::vss2_variable_t::_clean_up(vss2_variable_t *this)

{
  vss2_variable_t *this_local;
  
  return;
}

Assistant:

void edk2_vss2_t::vss2_variable_t::_clean_up() {
    if (!n_invoke_offset) {
    }
    if (!n_signature_last) {
    }
    if (!n_state) {
    }
    if (!n_reserved) {
    }
    if (!n_attributes) {
    }
    if (!n_len_name) {
    }
    if (!n_len_data) {
    }
    if (!n_timestamp) {
    }
    if (!n_pubkey_index) {
    }
    if (!n_len_name_auth) {
    }
    if (!n_len_data_auth) {
    }
    if (!n_vendor_guid) {
    }
    if (!n_name_auth) {
    }
    if (!n_data_auth) {
    }
    if (!n_invoke_end_offset_auth) {
    }
    if (!n_alignment_padding_auth) {
    }
    if (!n_name) {
    }
    if (!n_data) {
    }
    if (!n_invoke_end_offset) {
    }
    if (!n_alignment_padding) {
    }
}